

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_get_node_siblings(lyd_node *data,lys_node *schema,ly_set *set)

{
  uint uVar1;
  char *__assertion;
  
  if (set->number == 0) {
    if (schema == (lys_node *)0x0) {
      __assertion = "schema";
      uVar1 = 0x32;
    }
    else {
      if ((schema->nodetype & 0xc1bd) != LYS_UNKNOWN) {
        if (data == (lyd_node *)0x0) {
          uVar1 = 0;
        }
        else {
          for (; data != (lyd_node *)0x0; data = data->next) {
            if (data->schema == schema) {
              ly_set_add(set,data,1);
            }
          }
          uVar1 = set->number;
        }
        return uVar1;
      }
      __assertion = 
      "schema->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF | LYS_RPC | LYS_ACTION)"
      ;
      uVar1 = 0x34;
    }
  }
  else {
    __assertion = "set && !set->number";
    uVar1 = 0x31;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                ,uVar1,
                "int lyd_get_node_siblings(const struct lyd_node *, const struct lys_node *, struct ly_set *)"
               );
}

Assistant:

static int
lyd_get_node_siblings(const struct lyd_node *data, const struct lys_node *schema, struct ly_set *set)
{
    const struct lyd_node *iter;

    assert(set && !set->number);
    assert(schema);
    assert(schema->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF | LYS_RPC |
                               LYS_ACTION));

    if (!data) {
        return 0;
    }

    LY_TREE_FOR(data, iter) {
        if (iter->schema == schema) {
            ly_set_add(set, (void*)iter, LY_SET_OPT_USEASLIST);
        }
    }

    return set->number;
}